

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O2

void jpeg_idct_11x11(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  JSAMPLE *pJVar5;
  void *pvVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  int aiStack_198 [90];
  
  pJVar5 = cinfo->sample_range_limit;
  pvVar6 = compptr->dct_table;
  for (lVar20 = 0; (int)lVar20 != 8; lVar20 = lVar20 + 1) {
    lVar15 = (long)*(short *)((long)pvVar6 + lVar20 * 2) * (long)coef_block[lVar20] * 0x2000;
    lVar7 = (long)*(short *)((long)pvVar6 + lVar20 * 2 + 0x20) * (long)coef_block[lVar20 + 0x10];
    lVar22 = (long)*(short *)((long)pvVar6 + lVar20 * 2 + 0x40) * (long)coef_block[lVar20 + 0x20];
    lVar9 = (long)*(short *)((long)pvVar6 + lVar20 * 2 + 0x60) * (long)coef_block[lVar20 + 0x30];
    lVar12 = (lVar9 + lVar7) - lVar22;
    lVar23 = (lVar22 - lVar9) * 0x517e;
    lVar29 = lVar12 * 0x2b6c + lVar15 + 0x400;
    lVar26 = (lVar22 - lVar7) * 0xdc9 + lVar29;
    lVar37 = lVar22 * -0x3a4c + lVar23 + lVar26;
    lVar32 = lVar9 * 0x43b5 + lVar23 + lVar29;
    lVar26 = lVar7 * -0x306f + lVar26;
    lVar29 = (lVar9 + lVar7) * -0x24fb + lVar29;
    lVar40 = lVar9 * -0x193d + lVar29;
    lVar29 = lVar7 * -0x2c83 + lVar22 * 0x3e39 + lVar29;
    lVar35 = (long)*(short *)((long)pvVar6 + lVar20 * 2 + 0x10) * (long)coef_block[lVar20 + 8];
    lVar22 = (long)*(short *)((long)pvVar6 + lVar20 * 2 + 0x30) * (long)coef_block[lVar20 + 0x18];
    lVar18 = (long)*(short *)((long)pvVar6 + lVar20 * 2 + 0x50) * (long)coef_block[lVar20 + 0x28];
    lVar27 = (long)*(short *)((long)pvVar6 + lVar20 * 2 + 0x70) * (long)coef_block[lVar20 + 0x38];
    lVar23 = (lVar27 + lVar18 + lVar22 + lVar35) * 0xcc0;
    lVar19 = (lVar22 + lVar35) * 0x1c6a;
    lVar7 = (lVar18 + lVar35) * 0x1574;
    lVar9 = (lVar22 + lVar18) * -0x2537 + lVar23;
    lVar24 = lVar18 * -0x2626 + lVar7 + lVar9;
    lVar16 = (lVar27 + lVar22) * -0x398b;
    lVar9 = lVar22 * 0x4258 + lVar19 + lVar16 + lVar9;
    lVar17 = (lVar27 + lVar35) * 3000 + lVar23;
    lVar7 = lVar35 * -0x1d8a + lVar19 + lVar7 + lVar17;
    lVar17 = lVar27 * 0x4347 + lVar16 + lVar17;
    lVar23 = lVar27 * -0x35ea + lVar18 * 0x200b + lVar22 * -0x2ef3 + lVar23;
    aiStack_198[lVar20] = (int)((ulong)(lVar7 + lVar32) >> 0xb);
    aiStack_198[lVar20 + 0x50] = (int)((ulong)(lVar32 - lVar7) >> 0xb);
    aiStack_198[lVar20 + 8] = (int)((ulong)(lVar9 + lVar37) >> 0xb);
    aiStack_198[lVar20 + 0x48] = (int)((ulong)(lVar37 - lVar9) >> 0xb);
    aiStack_198[lVar20 + 0x10] = (int)((ulong)(lVar24 + lVar40) >> 0xb);
    aiStack_198[lVar20 + 0x40] = (int)((ulong)(lVar40 - lVar24) >> 0xb);
    aiStack_198[lVar20 + 0x18] = (int)((ulong)(lVar17 + lVar26) >> 0xb);
    aiStack_198[lVar20 + 0x38] = (int)((ulong)(lVar26 - lVar17) >> 0xb);
    aiStack_198[lVar20 + 0x20] = (int)((ulong)(lVar23 + lVar29) >> 0xb);
    aiStack_198[lVar20 + 0x30] = (int)((ulong)(lVar29 - lVar23) >> 0xb);
    aiStack_198[lVar20 + 0x28] = (int)(lVar12 * 0x7ffffffd2bf + lVar15 + 0x400U >> 0xb);
  }
  uVar8 = (ulong)output_col;
  for (lVar20 = 0; lVar20 != 0x58; lVar20 = lVar20 + 8) {
    iVar1 = aiStack_198[lVar20];
    iVar28 = aiStack_198[lVar20 + 1];
    iVar2 = aiStack_198[lVar20 + 2];
    iVar3 = aiStack_198[lVar20 + 4];
    iVar4 = aiStack_198[lVar20 + 6];
    iVar10 = (iVar4 + iVar2) - iVar3;
    iVar25 = (iVar3 - iVar4) * 0x517e;
    iVar30 = iVar10 * 0x2b6c + iVar1 * 0x2000 + 0x20000;
    iVar13 = (iVar3 - iVar2) * 0xdc9 + iVar30;
    iVar21 = iVar3 * -0x3a4c + iVar25 + iVar13;
    iVar36 = iVar4 * 0x43b5 + iVar25 + iVar30;
    iVar13 = iVar2 * -0x306f + iVar13;
    iVar30 = (iVar4 + iVar2) * -0x24fb + iVar30;
    iVar14 = iVar4 * -0x193d + iVar30;
    iVar30 = iVar2 * -0x2c83 + iVar3 * 0x3e39 + iVar30;
    iVar2 = aiStack_198[lVar20 + 3];
    iVar3 = aiStack_198[lVar20 + 5];
    iVar4 = aiStack_198[lVar20 + 7];
    iVar11 = (iVar4 + iVar3 + iVar2 + iVar28) * 0xcc0;
    iVar33 = (iVar2 + iVar28) * 0x1c6a;
    iVar25 = (iVar28 + iVar3) * 0x1574;
    iVar34 = (iVar2 + iVar3) * -0x2537 + iVar11;
    iVar31 = iVar3 * -0x2626 + iVar25 + iVar34;
    iVar38 = (iVar4 + iVar2) * -0x398b;
    iVar34 = iVar2 * 0x4258 + iVar33 + iVar38 + iVar34;
    iVar39 = (iVar4 + iVar28) * 3000 + iVar11;
    iVar28 = iVar28 * -0x1d8a + iVar33 + iVar25 + iVar39;
    iVar39 = iVar4 * 0x4347 + iVar38 + iVar39;
    iVar11 = iVar4 * -0x35ea + iVar3 * 0x200b + iVar2 * -0x2ef3 + iVar11;
    lVar7 = *(long *)((long)output_buf + lVar20);
    *(JSAMPLE *)(lVar7 + uVar8) = pJVar5[(ulong)((uint)(iVar28 + iVar36) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 10 + uVar8) =
         pJVar5[(ulong)((uint)(iVar36 - iVar28) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 1 + uVar8) =
         pJVar5[(ulong)((uint)(iVar34 + iVar21) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 9 + uVar8) =
         pJVar5[(ulong)((uint)(iVar21 - iVar34) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 2 + uVar8) =
         pJVar5[(ulong)((uint)(iVar31 + iVar14) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 8 + uVar8) =
         pJVar5[(ulong)((uint)(iVar14 - iVar31) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 3 + uVar8) =
         pJVar5[(ulong)((uint)(iVar13 + iVar39) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 7 + uVar8) =
         pJVar5[(ulong)((uint)(iVar13 - iVar39) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 4 + uVar8) =
         pJVar5[(ulong)((uint)(iVar11 + iVar30) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 6 + uVar8) =
         pJVar5[(ulong)((uint)(iVar30 - iVar11) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar7 + 5 + uVar8) =
         pJVar5[(ulong)(iVar10 * 0xfffd2bf + iVar1 * 0x2000 + 0x20000U >> 0x12 & 0x3ff) + 0x80];
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_11x11(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 11];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp10 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp10 = LEFT_SHIFT(tmp10, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp10 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp20 = MULTIPLY(z2 - z3, FIX(2.546640132));     /* c2+c4 */
    tmp23 = MULTIPLY(z2 - z1, FIX(0.430815045));     /* c2-c6 */
    z4 = z1 + z3;
    tmp24 = MULTIPLY(z4, -FIX(1.155664402));         /* -(c2-c10) */
    z4 -= z2;
    tmp25 = tmp10 + MULTIPLY(z4, FIX(1.356927976));  /* c2 */
    tmp21 = tmp20 + tmp23 + tmp25 -
            MULTIPLY(z2, FIX(1.821790775));          /* c2+c4+c10-c6 */
    tmp20 += tmp25 + MULTIPLY(z3, FIX(2.115825087)); /* c4+c6 */
    tmp23 += tmp25 - MULTIPLY(z1, FIX(1.513598477)); /* c6+c8 */
    tmp24 += tmp25;
    tmp22 = tmp24 - MULTIPLY(z3, FIX(0.788749120));  /* c8+c10 */
    tmp24 += MULTIPLY(z2, FIX(1.944413522)) -        /* c2+c8 */
             MULTIPLY(z1, FIX(1.390975730));         /* c4+c10 */
    tmp25 = tmp10 - MULTIPLY(z4, FIX(1.414213562));  /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z1 + z2;
    tmp14 = MULTIPLY(tmp11 + z3 + z4, FIX(0.398430003)); /* c9 */
    tmp11 = MULTIPLY(tmp11, FIX(0.887983902));           /* c3-c9 */
    tmp12 = MULTIPLY(z1 + z3, FIX(0.670361295));         /* c5-c9 */
    tmp13 = tmp14 + MULTIPLY(z1 + z4, FIX(0.366151574)); /* c7-c9 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(0.923107866));              /* c7+c5+c3-c1-2*c9 */
    z1    = tmp14 - MULTIPLY(z2 + z3, FIX(1.163011579)); /* c7+c9 */
    tmp11 += z1 + MULTIPLY(z2, FIX(2.073276588));        /* c1+c7+3*c9-c3 */
    tmp12 += z1 - MULTIPLY(z3, FIX(1.192193623));        /* c3+c5-c7-c9 */
    z1    = MULTIPLY(z2 + z4, -FIX(1.798248910));        /* -(c1+c9) */
    tmp11 += z1;
    tmp13 += z1 + MULTIPLY(z4, FIX(2.102458632));        /* c1+c5+c9-c7 */
    tmp14 += MULTIPLY(z2, -FIX(1.467221301)) +           /* -(c5+c9) */
             MULTIPLY(z3, FIX(1.001388905)) -            /* c1-c9 */
             MULTIPLY(z4, FIX(1.684843907));             /* c3+c9 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 11 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 11; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp10 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp10 = LEFT_SHIFT(tmp10, CONST_BITS);

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[4];
    z3 = (JLONG)wsptr[6];

    tmp20 = MULTIPLY(z2 - z3, FIX(2.546640132));     /* c2+c4 */
    tmp23 = MULTIPLY(z2 - z1, FIX(0.430815045));     /* c2-c6 */
    z4 = z1 + z3;
    tmp24 = MULTIPLY(z4, -FIX(1.155664402));         /* -(c2-c10) */
    z4 -= z2;
    tmp25 = tmp10 + MULTIPLY(z4, FIX(1.356927976));  /* c2 */
    tmp21 = tmp20 + tmp23 + tmp25 -
            MULTIPLY(z2, FIX(1.821790775));          /* c2+c4+c10-c6 */
    tmp20 += tmp25 + MULTIPLY(z3, FIX(2.115825087)); /* c4+c6 */
    tmp23 += tmp25 - MULTIPLY(z1, FIX(1.513598477)); /* c6+c8 */
    tmp24 += tmp25;
    tmp22 = tmp24 - MULTIPLY(z3, FIX(0.788749120));  /* c8+c10 */
    tmp24 += MULTIPLY(z2, FIX(1.944413522)) -        /* c2+c8 */
             MULTIPLY(z1, FIX(1.390975730));         /* c4+c10 */
    tmp25 = tmp10 - MULTIPLY(z4, FIX(1.414213562));  /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = z1 + z2;
    tmp14 = MULTIPLY(tmp11 + z3 + z4, FIX(0.398430003)); /* c9 */
    tmp11 = MULTIPLY(tmp11, FIX(0.887983902));           /* c3-c9 */
    tmp12 = MULTIPLY(z1 + z3, FIX(0.670361295));         /* c5-c9 */
    tmp13 = tmp14 + MULTIPLY(z1 + z4, FIX(0.366151574)); /* c7-c9 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(0.923107866));              /* c7+c5+c3-c1-2*c9 */
    z1    = tmp14 - MULTIPLY(z2 + z3, FIX(1.163011579)); /* c7+c9 */
    tmp11 += z1 + MULTIPLY(z2, FIX(2.073276588));        /* c1+c7+3*c9-c3 */
    tmp12 += z1 - MULTIPLY(z3, FIX(1.192193623));        /* c3+c5-c7-c9 */
    z1    = MULTIPLY(z2 + z4, -FIX(1.798248910));        /* -(c1+c9) */
    tmp11 += z1;
    tmp13 += z1 + MULTIPLY(z4, FIX(2.102458632));        /* c1+c5+c9-c7 */
    tmp14 += MULTIPLY(z2, -FIX(1.467221301)) +           /* -(c5+c9) */
             MULTIPLY(z3, FIX(1.001388905)) -            /* c1-c9 */
             MULTIPLY(z4, FIX(1.684843907));             /* c3+c9 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}